

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

int Mpm_CutCompareArea2(Mpm_Uni_t *pOld,Mpm_Uni_t *pNew)

{
  int iVar1;
  
  iVar1 = pOld->mArea - pNew->mArea;
  if ((((iVar1 == 0) && (iVar1 = pOld->mEdge - pNew->mEdge, iVar1 == 0)) &&
      (iVar1 = pOld->mAveRefs - pNew->mAveRefs, iVar1 == 0)) &&
     (iVar1 = (*(uint *)&(pOld->pCut).field_0x4 >> 0x1b) -
              (*(uint *)&(pNew->pCut).field_0x4 >> 0x1b), iVar1 == 0)) {
    iVar1 = pOld->mTime - pNew->mTime;
  }
  return iVar1;
}

Assistant:

int Mpm_CutCompareArea2( Mpm_Uni_t * pOld, Mpm_Uni_t * pNew )
{
    if ( pOld->mArea        != pNew->mArea         ) return pOld->mArea        - pNew->mArea;
    if ( pOld->mEdge        != pNew->mEdge         ) return pOld->mEdge        - pNew->mEdge;
    if ( pOld->mAveRefs     != pNew->mAveRefs      ) return pOld->mAveRefs     - pNew->mAveRefs;
    if ( pOld->pCut.nLeaves != pNew->pCut.nLeaves  ) return pOld->pCut.nLeaves - pNew->pCut.nLeaves;
    if ( pOld->mTime        != pNew->mTime         ) return pOld->mTime        - pNew->mTime;
    return 0;
}